

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_EndProcessing(PaAlsaStream *self,unsigned_long numFrames,int *xrunOccurred)

{
  int local_28;
  PaError local_24;
  int xrun;
  PaError result;
  int *xrunOccurred_local;
  unsigned_long numFrames_local;
  PaAlsaStream *self_local;
  
  local_24 = 0;
  local_28 = 0;
  _xrun = xrunOccurred;
  xrunOccurred_local = (int *)numFrames;
  numFrames_local = (unsigned_long)self;
  if (((self->capture).pcm == (snd_pcm_t *)0x0) ||
     (paUtilErr_ = PaAlsaStreamComponent_EndProcessing(&self->capture,numFrames,&local_28),
     -1 < paUtilErr_)) {
    if (*(long *)(numFrames_local + 0x340) != 0) {
      if ((*(int *)(numFrames_local + 0x310) < *(int *)(numFrames_local + 0x314)) &&
         (paUtilErr_ = PaAlsaStreamComponent_DoChannelAdaption
                                 ((PaAlsaStreamComponent *)(numFrames_local + 0x308),
                                  (PaUtilBufferProcessor *)(numFrames_local + 0x68),
                                  (int)xrunOccurred_local), paUtilErr_ < 0)) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3662\n"
                         );
        local_24 = paUtilErr_;
      }
      else {
        paUtilErr_ = PaAlsaStreamComponent_EndProcessing
                               ((PaAlsaStreamComponent *)(numFrames_local + 0x308),
                                (unsigned_long)xrunOccurred_local,&local_28);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3664\n"
                           );
          local_24 = paUtilErr_;
        }
      }
    }
  }
  else {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3656\n"
                     );
    local_24 = paUtilErr_;
  }
  *_xrun = local_28;
  return local_24;
}

Assistant:

static PaError PaAlsaStream_EndProcessing( PaAlsaStream *self, unsigned long numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    int xrun = 0;

    if( self->capture.pcm )
    {
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun ) );
    }
    if( self->playback.pcm )
    {
        if( self->playback.numHostChannels > self->playback.numUserChannels )
        {
            PA_ENSURE( PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames ) );
        }
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun ) );
    }

error:
    *xrunOccurred = xrun;
    return result;
}